

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

bool __thiscall
v_hashmap<unsigned_long,_features>::contains
          (v_hashmap<unsigned_long,_features> *this,unsigned_long *key,size_t hash)

{
  bool bVar1;
  hash_elem *phVar2;
  undefined8 uVar3;
  ulong in_RDX;
  unsigned_long *in_RSI;
  v_hashmap<unsigned_long,_features> *in_RDI;
  stringstream __msg;
  size_t first_position;
  size_t sz;
  unsigned_long *in_stack_fffffffffffffdf8;
  v_hashmap<unsigned_long,_features> *in_stack_fffffffffffffe00;
  unsigned_long *key_00;
  string *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  vw_exception *in_stack_fffffffffffffe30;
  stringstream local_1b8 [16];
  ostream local_1a8;
  ulong local_30;
  size_t local_28;
  ulong local_20;
  unsigned_long *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = base_size(in_stack_fffffffffffffe00);
  local_30 = local_20 % local_28;
  in_RDI->last_position = local_30;
  do {
    phVar2 = v_array<v_hashmap<unsigned_long,_features>::hash_elem>::operator[]
                       (&in_RDI->dat,in_RDI->last_position);
    if ((phVar2->occupied & 1U) == 0) {
      return false;
    }
    phVar2 = v_array<v_hashmap<unsigned_long,_features>::hash_elem>::operator[]
                       (&in_RDI->dat,in_RDI->last_position);
    if (phVar2->hash == local_20) {
      key_00 = local_18;
      v_array<v_hashmap<unsigned_long,_features>::hash_elem>::operator[]
                (&in_RDI->dat,in_RDI->last_position);
      bVar1 = is_equivalent(in_RDI,key_00,in_stack_fffffffffffffdf8);
      if (bVar1) {
        return true;
      }
    }
    in_RDI->last_position = in_RDI->last_position + 1;
    if (local_28 <= in_RDI->last_position) {
      in_RDI->last_position = 0;
    }
  } while (in_RDI->last_position != local_30);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(&local_1a8,"error: v_hashmap did not grow enough!");
  uVar3 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
             in_stack_fffffffffffffe18);
  __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool contains(const K& key, size_t hash)
  {
    size_t sz = base_size();
    size_t first_position = hash % sz;
    last_position = first_position;
    while (true)
    {  // if there's nothing there, obviously we don't contain it
      if (!dat[last_position].occupied)
        return false;

      // there's something there: maybe it's us
      if ((dat[last_position].hash == hash) && is_equivalent(key, dat[last_position].key))
        return true;

      // there's something there that's NOT us -- advance pointer
      last_position++;
      if (last_position >= sz)
        last_position = 0;

      // check to make sure we haven't cycled around -- this is a bug!
      if (last_position == first_position)
        THROW("error: v_hashmap did not grow enough!");
    }
  }